

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O2

void __thiscall CTPNObjProp::gen_setMethod(CTPNObjProp *this)

{
  uint uVar1;
  CTcGenTarg *pCVar2;
  CTcSymbol *pCVar3;
  size_t sVar4;
  void *__buf;
  void *__buf_00;
  
  pCVar3 = CTcPrsSymtab::find(G_prs->global_symtab_,"setMethod",9);
  if ((pCVar3 != (CTcSymbol *)0x0) &&
     (*(int *)&(pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 == 3
     )) {
    CTcGenTarg::write_op(G_cg,'\n');
    CTcDataStream::write_prop_id
              (&G_cs->super_CTcDataStream,
               (uint)(((this->super_CTPNObjPropBase).prop_sym_)->super_CTcSymPropBase).prop_);
    pCVar2 = G_cg;
    uVar1 = G_cg->sp_depth_;
    sVar4 = (size_t)uVar1;
    G_cg->sp_depth_ = uVar1 + 1;
    if (pCVar2->max_sp_depth_ <= (int)uVar1) {
      pCVar2->max_sp_depth_ = uVar1 + 1;
    }
    CTcGenTarg::write_op(pCVar2,0xa6);
    CTcDataStream::write(&G_cs->super_CTcDataStream,2,__buf,sVar4);
    pCVar2 = G_cg;
    uVar1 = G_cg->sp_depth_;
    sVar4 = (size_t)uVar1;
    G_cg->sp_depth_ = uVar1 + 1;
    if (pCVar2->max_sp_depth_ <= (int)uVar1) {
      pCVar2->max_sp_depth_ = uVar1 + 1;
    }
    CTcGenTarg::write_op(pCVar2,'a');
    CTcDataStream::write(&G_cs->super_CTcDataStream,2,__buf_00,sVar4);
    CTcDataStream::write_prop_id
              (&G_cs->super_CTcDataStream,
               (uint)*(ushort *)
                      &pCVar3[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                       _vptr_CVmHashEntry);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -3;
    return;
  }
  CTcTokenizer::log_error(0x2cfc,9,"setMethod");
  return;
}

Assistant:

void CTPNObjProp::gen_setMethod()
{
    /* look up the setMethod property */
    CTcSymProp *setm = (CTcSymProp *)G_prs->get_global_symtab()->find(
        "setMethod", 9);
    if (setm == 0 || setm->get_type() != TC_SYM_PROP)
    {
        G_tok->log_error(TCERR_SYM_NOT_PROP, 9, "setMethod");
        return;
    }
    
    /* push the property ID */
    G_cg->write_op(OPC_PUSHPROPID);
    G_cs->write_prop_id(prop_sym_->get_prop());
    G_cg->note_push();

    /* re-push the object reference (it's on the stack above the value) */
    G_cg->write_op(OPC_GETSPN);
    G_cs->write(2);
    G_cg->note_push();

    /* generate <obj>.setMethod(<prop>, string) */
    G_cg->write_op(OPC_CALLPROP);
    G_cs->write(2);
    G_cs->write_prop_id(setm->get_prop());
    G_cg->note_pop(3);
}